

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

InternalParseResult * __thiscall
Catch::Clara::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  string *optToken;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *pvVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  TokenStream remainingTokens;
  Result validationResult;
  undefined1 local_128 [24];
  undefined1 local_110 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_e8;
  Token local_d0;
  Token local_a8;
  BasicResult<void> local_80;
  ParseState local_50;
  
  (*(this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
    super_ParserBase._vptr_ParserBase[2])(&local_80);
  if (local_80.super_ResultValueBase<void>.super_ResultBase.m_type != Ok) {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_80);
    goto LAB_001503b6;
  }
  local_f8._M_allocated_capacity = (size_type)(tokens->it)._M_current;
  local_f8._8_8_ = (tokens->itEnd)._M_current;
  std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::vector
            (&local_e8,&tokens->m_tokenBuffer);
  if ((local_e8.
       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_e8.
       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_f8._M_allocated_capacity == local_f8._8_8_)) {
LAB_00150333:
    local_128._0_4_ = 1;
    local_128._8_8_ = local_f8._M_allocated_capacity;
    local_128._16_8_ = local_f8._8_8_;
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::vector
              ((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *)
               local_110,&local_e8);
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
    super_ResultBase.m_type = Ok;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_003240d0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_type = local_128._0_4_;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_remainingTokens.it._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._8_8_;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
    m_value.m_remainingTokens.itEnd._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._16_8_;
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::vector
              (&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,
               (vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *)
               local_110);
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00324078;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::~vector
              ((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *)
               local_110);
  }
  else {
    if (local_e8.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_e8.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!m_tokenBuffer.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                    ,0x11d3,"const Token *Catch::Clara::Detail::TokenStream::operator->() const");
    }
    if ((local_e8.
         super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
         ._M_impl.super__Vector_impl_data._M_start)->type != Option) goto LAB_00150333;
    Detail::TokenStream::operator*(&local_a8,(TokenStream *)&local_f8);
    optToken = &local_a8.token;
    bVar3 = isMatch(this,optToken);
    if (!bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.token._M_dataplus._M_p != &local_a8.token.field_2) {
        operator_delete(local_a8.token._M_dataplus._M_p,
                        local_a8.token.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00150333;
    }
    iVar4 = (*((this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_BoundRef[3])();
    peVar2 = (this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
             super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((char)iVar4 == '\0') {
      Detail::TokenStream::operator++((TokenStream *)&local_f8);
      if ((local_e8.
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_e8.
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (local_f8._M_allocated_capacity == local_f8._8_8_)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,"Expected argument following ",optToken);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
                  (__return_storage_ptr__,RuntimeError,(string *)local_128);
        local_d0.token.field_2._M_allocated_capacity = local_128._16_8_;
        local_d0.token._M_dataplus._M_p = (pointer)local_128._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_128 + 0x10)) goto LAB_001506f3;
      }
      else {
        Detail::TokenStream::operator*(&local_d0,(TokenStream *)&local_f8);
        if (local_d0.type == Argument) {
          (*peVar2->_vptr_BoundRef[4])(local_128,peVar2,&local_d0.token);
          if (local_128._8_4_ == Ok) {
            (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_128._0_8_ + 0x10))->_M_allocated_capacity)();
            if (local_128._12_4_ != 2) {
              local_128._0_8_ = &PTR__BasicResult_00320ed0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._16_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_110 + 8)) {
                operator_delete((void *)local_128._16_8_,(ulong)(local_110._8_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0.token._M_dataplus._M_p != &local_d0.token.field_2) goto LAB_0015060c;
              goto LAB_00150614;
            }
            (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_128._0_8_ + 0x10))->_M_allocated_capacity)();
            pvVar1 = &local_50.m_remainingTokens.m_tokenBuffer;
            local_50.m_type = local_128._12_4_;
            local_50.m_remainingTokens.it._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_f8._M_allocated_capacity;
            local_50.m_remainingTokens.itEnd._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._8_8_
            ;
            std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
            vector(pvVar1,&local_e8);
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            ok<Catch::Clara::Detail::ParseState>(__return_storage_ptr__,&local_50);
            std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
            ~vector(pvVar1);
          }
          else {
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            BasicResult<Catch::Clara::ParseResultType>
                      (__return_storage_ptr__,
                       (BasicResult<Catch::Clara::ParseResultType> *)local_128);
          }
          local_128._0_8_ = &PTR__BasicResult_00320ed0;
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_128._16_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._16_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_110 + 8)) {
LAB_001506d0:
            operator_delete(paVar5,(ulong)(local_110._8_8_ + 1));
          }
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128,"Expected argument following ",optToken);
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
                    (__return_storage_ptr__,RuntimeError,(string *)local_128);
          local_110._8_8_ = local_128._16_8_;
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_128._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_128 + 0x10)) goto LAB_001506d0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.token._M_dataplus._M_p == &local_d0.token.field_2) goto LAB_001506f3;
      }
LAB_001506eb:
      operator_delete(local_d0.token._M_dataplus._M_p,
                      (ulong)(local_d0.token.field_2._M_allocated_capacity + 1));
    }
    else {
      (*peVar2->_vptr_BoundRef[4])(local_128,peVar2,1);
      if (local_128._8_4_ == Ok) {
        (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_128._0_8_ + 0x10))->_M_allocated_capacity)();
        if (local_128._12_4_ == 2) {
          (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_128._0_8_ + 0x10))->_M_allocated_capacity)();
          pvVar1 = &local_50.m_remainingTokens.m_tokenBuffer;
          local_50.m_type = local_128._12_4_;
          local_50.m_remainingTokens.it._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_f8._M_allocated_capacity;
          local_50.m_remainingTokens.itEnd._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._8_8_;
          std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
          vector(pvVar1,&local_e8);
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::
          ok<Catch::Clara::Detail::ParseState>(__return_storage_ptr__,&local_50);
          std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
          ~vector(pvVar1);
          goto LAB_00150587;
        }
        local_128._0_8_ = &PTR__BasicResult_00320ed0;
        local_d0.token.field_2._M_allocated_capacity = local_110._8_8_;
        local_d0.token._M_dataplus._M_p = (pointer)local_128._16_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._16_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_110 + 8)) {
LAB_0015060c:
          operator_delete(local_d0.token._M_dataplus._M_p,
                          (ulong)(local_d0.token.field_2._M_allocated_capacity + 1));
        }
LAB_00150614:
        Detail::TokenStream::operator++((TokenStream *)&local_f8);
        local_128._0_8_ = local_128._0_8_ & 0xffffffff00000000;
        local_128._8_8_ = local_f8._M_allocated_capacity;
        local_128._16_8_ = local_f8._8_8_;
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        vector((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *)
               local_110,&local_e8);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                  (__return_storage_ptr__,(ParseState *)local_128);
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        ~vector((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *
                )local_110);
      }
      else {
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::
        BasicResult<Catch::Clara::ParseResultType>
                  (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)local_128);
LAB_00150587:
        local_128._0_8_ = &PTR__BasicResult_00320ed0;
        local_d0.token.field_2._M_allocated_capacity = local_110._8_8_;
        local_d0.token._M_dataplus._M_p = (pointer)local_128._16_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._16_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_110 + 8)) goto LAB_001506eb;
      }
    }
LAB_001506f3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.token._M_dataplus._M_p != &local_a8.token.field_2) {
      operator_delete(local_a8.token._M_dataplus._M_p,
                      local_a8.token.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::~vector
            (&local_e8);
LAB_001503b6:
  local_80.super_ResultValueBase<void>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_00320cf8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_errorMessage._M_dataplus._M_p != &local_80.m_errorMessage.field_2) {
    operator_delete(local_80.m_errorMessage._M_dataplus._M_p,
                    local_80.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Opt::parse(std::string const&,
                                       Detail::TokenStream const& tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            auto remainingTokens = tokens;
            if (remainingTokens &&
                remainingTokens->type == Detail::TokenType::Option) {
                auto const& token = *remainingTokens;
                if (isMatch(token.token)) {
                    if (m_ref->isFlag()) {
                        auto flagRef =
                            static_cast<Detail::BoundFlagRefBase*>(
                                m_ref.get());
                        auto result = flagRef->setFlag(true);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), remainingTokens));
                    } else {
                        auto valueRef =
                            static_cast<Detail::BoundValueRefBase*>(
                                m_ref.get());
                        ++remainingTokens;
                        if (!remainingTokens)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        auto const& argToken = *remainingTokens;
                        if (argToken.type != Detail::TokenType::Argument)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        const auto result = valueRef->setValue(argToken.token);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), remainingTokens));
                    }
                    return Detail::InternalParseResult::ok(Detail::ParseState(
                        ParseResultType::Matched, ++remainingTokens));
                }
            }
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, remainingTokens));
        }